

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

bool __thiscall FIX::Parser::readFixMessage(Parser *this,string *str)

{
  bool bVar1;
  long lVar2;
  Parser *this_00;
  size_type pos;
  int length;
  size_type local_30;
  int local_24;
  
  local_30 = 0;
  if (1 < (this->m_buffer)._M_string_length) {
    local_30 = std::__cxx11::string::find((char *)this,0x1cc4e9,0);
    if (local_30 == 0xffffffffffffffff) {
      return false;
    }
    this_00 = this;
    std::__cxx11::string::erase((ulong)this,0);
    local_24 = 0;
    bVar1 = extractLength(this_00,&local_24,&local_30,&this->m_buffer);
    if (((bVar1) &&
        (local_30 = (long)local_24 + local_30, local_30 <= (this->m_buffer)._M_string_length)) &&
       (lVar2 = std::__cxx11::string::find((char *)this,0x1cc4ec,local_30 - 1), lVar2 != -1)) {
      local_30 = lVar2 + 4;
      lVar2 = std::__cxx11::string::find((char *)this,0x1cc4e7,local_30);
      if (lVar2 != -1) {
        local_30 = lVar2 + 1;
        std::__cxx11::string::assign((string *)str,(ulong)this,0);
        std::__cxx11::string::erase((ulong)this,0);
        return true;
      }
    }
  }
  return false;
}

Assistant:

EXCEPT(MessageParseError) {
  std::string::size_type pos = 0;

  if (m_buffer.length() < 2) {
    return false;
  }
  pos = m_buffer.find("8=");
  if (pos == std::string::npos) {
    return false;
  }
  m_buffer.erase(0, pos);

  int length = 0;

  try {
    if (extractLength(length, pos, m_buffer)) {
      pos += length;
      if (m_buffer.size() < pos) {
        return false;
      }

      pos = m_buffer.find("\00110=", pos - 1);
      if (pos == std::string::npos) {
        return false;
      }
      pos += 4;
      pos = m_buffer.find("\001", pos);
      if (pos == std::string::npos) {
        return false;
      }
      pos += 1;

      str.assign(m_buffer, 0, pos);
      m_buffer.erase(0, pos);
      return true;
    }
  } catch (MessageParseError &e) {
    if (length > 0) {
      m_buffer.erase(0, pos + length);
    } else {
      m_buffer.erase();
    }

    throw e;
  }

  return false;
}